

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

bool __thiscall Clasp::ImpliedList::assign(ImpliedList *this,Solver *s)

{
  uint uVar1;
  size_type sVar2;
  uint uVar3;
  pointer pIVar4;
  undefined8 uVar5;
  size_type sVar6;
  ulong uVar7;
  pointer pIVar8;
  long lVar9;
  AnteInfo *a;
  bool bVar10;
  
  uVar1 = (s->levels_).super_type.ebo_.size;
  sVar2 = (s->conflict_).ebo_.size;
  bVar10 = sVar2 == 0;
  pIVar4 = (this->lits).ebo_.buf;
  uVar7 = (ulong)this->front;
  pIVar8 = pIVar4 + uVar7;
  uVar3 = (this->lits).ebo_.size;
  if (this->front != uVar3) {
    bVar10 = sVar2 == 0;
    a = &pIVar4[uVar7].ante;
    lVar9 = (ulong)uVar3 * 0x18 + uVar7 * -0x18;
    do {
      if (*(uint *)((long)(a + -1) + 0xc) <= uVar1) {
        if (bVar10 == false) {
          bVar10 = false;
        }
        else {
          bVar10 = Solver::force(s,(Literal *)((long)(a + -1) + 8),(Antecedent *)a,
                                 (a->super_pair<Clasp::Antecedent,_unsigned_int>).second);
        }
        if ((*(uint *)((long)(a + -1) + 0xc) < uVar1) ||
           ((a->super_pair<Clasp::Antecedent,_unsigned_int>).first.data_ == 0)) {
          uVar5 = *(undefined8 *)((long)(a + -1) + 8);
          pIVar8->lit = (Literal)(int)uVar5;
          pIVar8->level = (int)((ulong)uVar5 >> 0x20);
          (pIVar8->ante).super_pair<Clasp::Antecedent,_unsigned_int>.first.data_ =
               (a->super_pair<Clasp::Antecedent,_unsigned_int>).first.data_;
          (pIVar8->ante).super_pair<Clasp::Antecedent,_unsigned_int>.second =
               (a->super_pair<Clasp::Antecedent,_unsigned_int>).second;
          pIVar8 = pIVar8 + 1;
        }
      }
      a = (AnteInfo *)((long)(a + 1) + 8);
      lVar9 = lVar9 + -0x18;
    } while (lVar9 != 0);
  }
  uVar3 = (this->lits).ebo_.size;
  sVar6 = (int)((long)(this->lits).ebo_.buf + ((ulong)uVar3 * 0x18 - (long)pIVar8) >> 3) *
          0x55555555 + uVar3;
  if (sVar6 == 0) {
    uVar1 = 0;
  }
  (this->lits).ebo_.size = sVar6;
  this->level = uVar1;
  if ((s->levels_).root < uVar1) {
    sVar6 = this->front;
  }
  this->front = sVar6;
  return bVar10;
}

Assistant:

bool ImpliedList::assign(Solver& s) {
	assert(front <= lits.size());
	bool ok             = !s.hasConflict();
	const uint32 DL     = s.decisionLevel();
	VecType::iterator j = lits.begin() + front;
	for (VecType::iterator it = j, end = lits.end(); it != end; ++it) {
		if(it->level <= DL) {
			ok = ok && s.force(it->lit, it->ante.ante(), it->ante.data());
			if (it->level < DL || it->ante.ante().isNull()) { *j++ = *it; }
		}
	}
	lits.erase(j, lits.end());
	level = DL * uint32(!lits.empty());
	front = level > s.rootLevel() ? front  : sizeVec(lits);
	return ok;
}